

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSat.c
# Opt level: O2

DdNode * Cudd_LargestCube(DdManager *manager,DdNode *f,int *length)

{
  int *piVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  st__table *visited;
  uint uVar5;
  uint *key;
  DdNode *pDVar6;
  int iVar7;
  ulong uVar8;
  uint *puVar9;
  DdNode *local_88;
  cuddPathPair *rootPair;
  int *local_40;
  cuddPathPair *T_pair;
  
  one = manager->one;
  zero = manager->zero;
  local_88 = (DdNode *)((ulong)one ^ 1);
  iVar3 = 1000000;
  if (zero != f && local_88 != f) {
    do {
      manager->reordered = 0;
      visited = st__init_table(st__ptrcmp,st__ptrhash);
      getLargest(f,visited);
      iVar3 = st__lookup(visited,(char *)((ulong)f & 0xfffffffffffffffe),(char **)&rootPair);
      if (iVar3 == 0) {
        return (DdNode *)0x0;
      }
      iVar3 = *(int *)((long)&rootPair->pos + (ulong)((uint)f * 4 & 4));
      local_88 = one;
      piVar1 = (int *)(((ulong)one & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      puVar9 = (uint *)((ulong)f & 0xfffffffffffffffe);
      iVar7 = iVar3;
      uVar5 = (uint)f;
      while( true ) {
        iVar7 = iVar7 + -1;
        if (*puVar9 == 0x7fffffff) break;
        uVar8 = *(ulong *)(puVar9 + 6) ^ 1;
        uVar2 = *(ulong *)(puVar9 + 4) ^ 1;
        if ((uVar5 & 1) == 0) {
          uVar8 = *(ulong *)(puVar9 + 6);
          uVar2 = *(ulong *)(puVar9 + 4);
        }
        key = (uint *)(uVar2 & 0xfffffffffffffffe);
        iVar4 = st__lookup(visited,(char *)key,(char **)&T_pair);
        if (iVar4 == 0) goto LAB_0065f2d4;
        uVar5 = (uint)uVar2;
        if ((uVar2 & 1) != 0) {
          if (iVar7 == T_pair->neg) goto LAB_0065f22e;
LAB_0065f1f0:
          key = (uint *)(uVar8 & 0xfffffffffffffffe);
          iVar4 = st__lookup(visited,(char *)key,(char **)&local_40);
          if (iVar4 != 0) {
            uVar5 = (uint)uVar8;
            if ((uVar8 & 1) == 0) {
              iVar4 = *local_40;
            }
            else {
              iVar4 = local_40[1];
            }
            if (iVar7 != iVar4) {
              fwrite("We shouldn\'t be here!\n",0x16,1,(FILE *)manager->err);
              manager->errorCode = CUDD_INTERNAL_ERROR;
              goto LAB_0065f2d4;
            }
            pDVar6 = (DdNode *)((ulong)manager->vars[*puVar9] ^ 1);
            goto LAB_0065f25e;
          }
LAB_0065f2d4:
          local_88 = (DdNode *)0x0;
          goto LAB_0065f2dc;
        }
        if (iVar7 != T_pair->pos) goto LAB_0065f1f0;
LAB_0065f22e:
        pDVar6 = manager->vars[*puVar9];
LAB_0065f25e:
        pDVar6 = cuddBddAndRecur(manager,pDVar6,local_88);
        if (pDVar6 == (DdNode *)0x0) {
          Cudd_RecursiveDeref(manager,local_88);
          goto LAB_0065f2d4;
        }
        piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(manager,local_88);
        puVar9 = key;
        local_88 = pDVar6;
      }
      piVar1 = (int *)(((ulong)local_88 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + -1;
LAB_0065f2dc:
      st__foreach(visited,freePathPair,(char *)0x0);
      st__free_table(visited);
    } while (manager->reordered == 1);
  }
  *length = iVar3;
  return local_88;
}

Assistant:

DdNode *
Cudd_LargestCube(
  DdManager * manager,
  DdNode * f,
  int * length)
{
    register    DdNode  *F;
    st__table    *visited;
    DdNode      *sol;
    cuddPathPair *rootPair;
    int         complement, cost;

    one = DD_ONE(manager);
    zero = DD_ZERO(manager);

    if (f == Cudd_Not(one) || f == zero) {
        *length = DD_BIGGY;
        return(Cudd_Not(one));
    }
    /* From this point on, a path exists. */

    do {
        manager->reordered = 0;

        /* Initialize visited table. */
        visited = st__init_table( st__ptrcmp, st__ptrhash);

        /* Now get the length of the shortest path(s) from f to 1. */
        (void) getLargest(f, visited);

        complement = Cudd_IsComplement(f);

        F = Cudd_Regular(f);

        if (! st__lookup(visited, (const char *)F, (char **)&rootPair)) return(NULL);

        if (complement) {
          cost = rootPair->neg;
        } else {
          cost = rootPair->pos;
        }

        /* Recover an actual shortest path. */
        sol = getCube(manager,visited,f,cost);

        st__foreach(visited, freePathPair, NULL);
        st__free_table(visited);

    } while (manager->reordered == 1);

    *length = cost;
    return(sol);

}